

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::minusSign(AffixTokenMatcherWarehouse *this)

{
  MinusSignMatcher *pMVar1;
  MinusSignMatcher MStack_68;
  
  MinusSignMatcher::MinusSignMatcher(&MStack_68,this->fSetupData->dfs,true);
  pMVar1 = MinusSignMatcher::operator=(&this->fMinusSign,&MStack_68);
  SymbolMatcher::~SymbolMatcher(&MStack_68.super_SymbolMatcher);
  return (NumberParseMatcher *)pMVar1;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::minusSign() {
    return fMinusSign = {fSetupData->dfs, true};
}